

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::DirectionalAtomTypesSectionParser::parseLine
          (DirectionalAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  DirectionalAdapter da;
  Mat3x3d I;
  string atomTypeName;
  StringTokenizer tokenizer;
  DirectionalAdapter local_130;
  string local_128;
  RealType local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  RealType local_e8;
  string local_e0;
  StringTokenizer local_c0;
  Mat3x3d local_68;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_c0,line,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_c0);
  if (iVar2 < 4) {
    snprintf(painCave.errMsg,2000,
             "DirectionalAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_e0,&local_c0);
    local_130.at_ = ForceField::getAtomType(ff,&local_e0);
    if (local_130.at_ == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "DirectionalAtomTypesSectionParser:: AtomType %s was not\n\tdeclared in the BaseAtomTypes or AtomTypes before being\n\tdeclared as a DirectionalAtomType!\n"
               ,local_e0._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0.0;
    uStack_100 = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_128.field_2._8_8_ = 0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_e8 = 0.0;
    local_128._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&local_c0);
    local_108 = StringTokenizer::nextTokenAsDouble(&local_c0);
    local_e8 = StringTokenizer::nextTokenAsDouble(&local_c0);
    lVar3 = 0;
    do {
      *(undefined8 *)
       ((long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3 + 0x10) = *(undefined8 *)((long)&local_128.field_2 + lVar3);
      uVar1 = *(undefined8 *)((long)&local_128._M_string_length + lVar3);
      *(undefined8 *)
       ((long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3) = *(undefined8 *)((long)&local_128._M_dataplus._M_p + lVar3);
      *(undefined8 *)
       ((long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3 + 8) = uVar1;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
    DirectionalAdapter::makeDirectional(&local_130,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.delim_._M_dataplus._M_p != &local_c0.delim_.field_2) {
    operator_delete(local_c0.delim_._M_dataplus._M_p,
                    local_c0.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.tokenString_._M_dataplus._M_p != &local_c0.tokenString_.field_2) {
    operator_delete(local_c0.tokenString_._M_dataplus._M_p,
                    local_c0.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DirectionalAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const std::string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in DirectionalAtomTypeSection, a line contains 4 tokens

    if (nTokens < 4) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DirectionalAtomTypesSectionParser:: AtomType %s was not\n"
                 "\tdeclared in the BaseAtomTypes or AtomTypes before being\n"
                 "\tdeclared as a DirectionalAtomType!\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }

      DirectionalAdapter da = DirectionalAdapter(atomType);
      Mat3x3d I;

      I(0, 0) = tokenizer.nextTokenAsDouble();
      I(1, 1) = tokenizer.nextTokenAsDouble();
      I(2, 2) = tokenizer.nextTokenAsDouble();

      da.makeDirectional(I);
    }
  }